

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

bool search::isRepetition(Board *pos)

{
  ulong uVar1;
  int iVar2;
  size_type sVar3;
  uint64_t uVar4;
  reference this;
  uint64_t uVar5;
  vector<board::Undo,_std::allocator<board::Undo>_> local_78;
  vector<board::Undo,_std::allocator<board::Undo>_> local_60;
  vector<board::Undo,_std::allocator<board::Undo>_> local_38;
  ulong local_20;
  size_t i;
  Board *pos_local;
  
  i = (size_t)pos;
  board::Board::getHistory(&local_38,pos);
  sVar3 = std::vector<board::Undo,_std::allocator<board::Undo>_>::size(&local_38);
  iVar2 = board::Board::getFiftyMove((Board *)i);
  std::vector<board::Undo,_std::allocator<board::Undo>_>::~vector(&local_38);
  local_20 = sVar3 - (long)iVar2;
  while( true ) {
    uVar1 = local_20;
    board::Board::getHistory(&local_60,(Board *)i);
    sVar3 = std::vector<board::Undo,_std::allocator<board::Undo>_>::size(&local_60);
    std::vector<board::Undo,_std::allocator<board::Undo>_>::~vector(&local_60);
    if (sVar3 <= uVar1) {
      return false;
    }
    uVar4 = board::Board::getHashKey((Board *)i);
    board::Board::getHistory(&local_78,(Board *)i);
    this = std::vector<board::Undo,_std::allocator<board::Undo>_>::operator[](&local_78,local_20);
    uVar5 = board::Undo::getHashKey(this);
    std::vector<board::Undo,_std::allocator<board::Undo>_>::~vector(&local_78);
    if (uVar4 == uVar5) break;
    local_20 = local_20 + 1;
  }
  return true;
}

Assistant:

bool search::isRepetition(board::Board& pos)
{
    for (size_t i = pos.getHistory().size() - pos.getFiftyMove(); i < pos.getHistory().size(); i++) {
        if (pos.getHashKey() == pos.getHistory()[i].getHashKey()) {
            return true;
        }
    }
    return false;
}